

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  ReadableFile *pRVar1;
  Disposer *pDVar2;
  LineBreakTable *pLVar3;
  Builder result;
  Reader statements_00;
  Builder result_00;
  SegmentBuilder *pSVar4;
  void *pvVar5;
  char *ptrCopy;
  SegmentBuilder *pSVar6;
  CapTableBuilder *pCVar7;
  ArrayPtr<const_char> content_00;
  ArrayPtr<const_char> input;
  Builder statements;
  Array<const_char> content;
  MallocMessageBuilder lexedBuilder;
  StructBuilder local_228;
  SegmentBuilder *local_1f8;
  CapTableBuilder *pCStack_1f0;
  undefined8 *local_1e8;
  BuilderArena *local_1d8;
  CapTableBuilder *local_1d0;
  PointerBuilder local_1c8;
  undefined1 local_1a8 [48];
  StructBuilder local_178;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  MallocMessageBuilder local_120;
  
  local_1d0 = orphanage.capTable;
  local_1d8 = orphanage.arena;
  pRVar1 = (this->file).ptr;
  (*(pRVar1->super_FsNode)._vptr_FsNode[2])(&local_120,pRVar1);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])
            (&local_228,pRVar1,0,local_120.super_MessageBuilder.arenaSpace[0]);
  pvVar5 = local_228.data;
  pCVar7 = local_228.capTable;
  pSVar4 = local_228.segment;
  if ((undefined8 *)local_228.data == (undefined8 *)0x0) {
    local_1f8 = (SegmentBuilder *)0x0;
    pCStack_1f0 = (CapTableBuilder *)0x0;
    local_1e8 = (undefined8 *)0x0;
    if (local_228.segment == (SegmentBuilder *)0x0) {
      pSVar6 = (SegmentBuilder *)0x0;
      pCVar7 = (CapTableBuilder *)0x0;
    }
    else {
      local_228.segment = (SegmentBuilder *)0x0;
      local_228.capTable = (CapTableBuilder *)0x0;
      pSVar6 = (SegmentBuilder *)0x0;
      (*(code *)*puRam0000000000000000)(0,pSVar4,1,pCVar7,pCVar7,0);
      pCVar7 = (CapTableBuilder *)0x0;
    }
  }
  else {
    local_1f8 = local_228.segment;
    pCStack_1f0 = local_228.capTable;
    local_1e8 = (undefined8 *)local_228.data;
    pSVar6 = local_228.segment;
  }
  pDVar2 = (this->lineBreaks).ptr.disposer;
  pLVar3 = (this->lineBreaks).ptr.ptr;
  (this->lineBreaks).ptr.disposer = (Disposer *)0x0;
  (this->lineBreaks).ptr.ptr = (LineBreakTable *)0x0;
  if (pLVar3 != (LineBreakTable *)0x0) {
    (**pDVar2->_vptr_Disposer)();
  }
  content_00.size_ = (size_t)pCVar7;
  content_00.ptr = (char *)pSVar6;
  LineBreakTable::LineBreakTable((LineBreakTable *)&this->lineBreaksSpace,content_00);
  pDVar2 = (this->lineBreaks).ptr.disposer;
  pLVar3 = (this->lineBreaks).ptr.ptr;
  (this->lineBreaks).ptr.disposer =
       (Disposer *)&kj::DestructorOnlyDisposer<capnp::compiler::LineBreakTable>::instance;
  (this->lineBreaks).ptr.ptr = (LineBreakTable *)&this->lineBreaksSpace;
  if (pLVar3 != (LineBreakTable *)0x0) {
    (**pDVar2->_vptr_Disposer)();
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c8,&local_120.super_MessageBuilder);
  local_1a8._16_8_ = local_1c8.pointer;
  local_1a8._0_8_ = local_1c8.segment;
  local_1a8._8_8_ = local_1c8.capTable;
  capnp::_::PointerBuilder::initStruct(&local_228,(PointerBuilder *)local_1a8,(StructSize)0x10000);
  result._builder.capTable = local_228.capTable;
  result._builder.segment = local_228.segment;
  result._builder.data = local_228.data;
  result._builder.pointers = local_228.pointers;
  result._builder.dataSize = local_228.dataSize;
  result._builder.pointerCount = local_228.pointerCount;
  result._builder._38_2_ = local_228._38_2_;
  input.size_ = (size_t)pCVar7;
  input.ptr = (char *)pSVar6;
  lex(input,result,(ErrorReporter *)this);
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)local_1a8,local_1d8,local_1d0,(StructSize)0x10000);
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_1a8._8_8_;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_1a8._16_8_;
  (__return_storage_ptr__->builder).location = (word *)local_1a8._24_8_;
  (__return_storage_ptr__->builder).tag.content = local_1a8._0_8_;
  local_1c8.segment = local_228.segment;
  local_1c8.capTable = local_228.capTable;
  local_1c8.pointer = local_228.pointers;
  capnp::_::PointerBuilder::getStructList
            ((ListBuilder *)local_1a8,&local_1c8,(StructSize)0x30002,(word *)0x0);
  capnp::_::ListBuilder::asReader((ListBuilder *)local_1a8);
  capnp::_::OrphanBuilder::asStruct(&local_178,&__return_storage_ptr__->builder,(StructSize)0x10000)
  ;
  statements_00.reader.capTable = (CapTableReader *)uStack_148;
  statements_00.reader.segment = (SegmentReader *)local_150;
  statements_00.reader.ptr = (byte *)local_140;
  statements_00.reader.elementCount = (undefined4)uStack_138;
  statements_00.reader.step = uStack_138._4_4_;
  statements_00.reader.structDataSize = (undefined4)local_130;
  statements_00.reader.structPointerCount = local_130._4_2_;
  statements_00.reader.elementSize = local_130._6_1_;
  statements_00.reader._39_1_ = local_130._7_1_;
  statements_00.reader._40_8_ = uStack_128;
  result_00._builder.capTable = local_178.capTable;
  result_00._builder.segment = local_178.segment;
  result_00._builder.data = local_178.data;
  result_00._builder.pointers = local_178.pointers;
  result_00._builder.dataSize = local_178.dataSize;
  result_00._builder.pointerCount = local_178.pointerCount;
  result_00._builder._38_2_ = local_178._38_2_;
  parseFile(statements_00,result_00,(ErrorReporter *)this,this->loader->fileIdsRequired);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  if (pSVar6 != (SegmentBuilder *)0x0) {
    local_1f8 = (SegmentBuilder *)0x0;
    pCStack_1f0 = (CapTableBuilder *)0x0;
    (*(code *)**pvVar5)(pvVar5,pSVar6,1,pCVar7,pCVar7,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->mmap(0, file->stat().size).releaseAsChars();

    lineBreaks = kj::none;  // In case loadContent() is called multiple times.
    lineBreaks = lineBreaksSpace.construct(content);

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<LexedStatements>();
    lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<ParsedFile>();
    parseFile(statements.getStatements(), parsed.get(), *this, loader.areFileIdsRequired());
    return parsed;
  }